

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

bool __thiscall
Am_Drawonable_Impl::add_wm_border_offset
          (Am_Drawonable_Impl *this,Window query_drawable,Window expected_parent,int *lb,int *tb,
          int *rb,int *bb,int *outer_left,int *outer_top)

{
  undefined1 local_84 [4];
  undefined1 local_80 [4];
  uint d_return_1;
  uint bw_return_1;
  uint h_return_1;
  uint w_return_1;
  int y_return;
  int x_return;
  uint d_return;
  uint bw_return;
  uint h_return;
  uint w_return;
  uint nchildren_return;
  Window *children_return;
  Window xlib_parent;
  Window root_return;
  int *rb_local;
  int *tb_local;
  int *lb_local;
  Window expected_parent_local;
  Window query_drawable_local;
  Am_Drawonable_Impl *this_local;
  
  root_return = (Window)rb;
  rb_local = tb;
  tb_local = lb;
  lb_local = (int *)expected_parent;
  expected_parent_local = query_drawable;
  query_drawable_local = (Window)this;
  XQueryTree(this->screen->display,query_drawable,&xlib_parent,&children_return,&w_return,&h_return)
  ;
  if (_w_return != 0) {
    XFree(_w_return);
  }
  if ((Window *)lb_local == children_return) {
    if (((((this->super_Am_Drawonable).title_bar & 1U) == 0) ||
        ((Am_Drawonable_Impl *)this->owner != this->screen->root)) ||
       (expected_parent_local != this->xlib_drawable)) {
      if (children_return == (Window *)this->screen->root->xlib_drawable) {
        XGetGeometry(this->screen->display,expected_parent_local,&xlib_parent,outer_left,outer_top,
                     &bw_return,&d_return,&x_return,&y_return);
        *tb_local = x_return + *tb_local;
        *(int *)root_return = x_return + *(int *)root_return;
        *rb_local = x_return + *rb_local;
        *bb = x_return + *bb;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else if (children_return == (Window *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    XGetGeometry(this->screen->display,expected_parent_local,&xlib_parent,&w_return_1,&h_return_1,
                 &bw_return_1,&d_return_1,local_80,local_84);
    *tb_local = w_return_1 + *tb_local;
    *rb_local = h_return_1 + *rb_local;
    *(int *)root_return = *tb_local;
    *bb = *tb_local;
    this_local._7_1_ =
         add_wm_border_offset
                   (this,(Window)children_return,(Window)lb_local,tb_local,rb_local,
                    (int *)root_return,bb,outer_left,outer_top);
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Drawonable_Impl::add_wm_border_offset(Window query_drawable,
                                         Window expected_parent, int &lb,
                                         int &tb, int &rb, int &bb,
                                         int &outer_left, int &outer_top)
{

  // Ask X for the parent of 'query_drawable' -- store value in xlib_parent
  Window root_return, xlib_parent, *children_return;
  unsigned int nchildren_return;
  XQueryTree(screen->display, query_drawable, &root_return, &xlib_parent,
             &children_return, &nchildren_return);

  // don't need list of children, so free it right away
  if (children_return)
    XFree(children_return);

  if (expected_parent == xlib_parent) {
    //std::cout << expected_parent << " == " << xlib_parent <<std::endl;

    // If the original window is supposed to have a title bar, and it is
    // at the top-level, but it has not yet been reparented to have a title
    // bar, then all this calculation is bogus.
    if (title_bar && (owner == screen->root) &&
        (query_drawable == xlib_drawable)) {
      //std::cout << "   parenting is messed up, returning false" <<std::endl;
      return false;
    }

    else {
      // done computing border widths (whatever was computed the last time
      // through the recursion is already correct) on MWM only!
      // TWM also uses bw_return here.
      if (xlib_parent == screen->root->xlib_drawable) {
        // We're dealing with a top-level window.  Find its actual outer vals.
        unsigned int w_return, h_return, bw_return, d_return;
        XGetGeometry(screen->display, query_drawable, &root_return, &outer_left,
                     &outer_top, &w_return, &h_return, &bw_return, &d_return);

        //     std::cout << "add_wm_borders: bw == " << bw_return
        //	<< ", query drawable == " << query_drawable <<std::endl;

        // In TWM, the borders are specified by this window's borderwidth.
        // Add this to the borders.  In MWM the values are 0 anyway.
        lb += bw_return;
        rb += bw_return;
        tb += bw_return;
        bb += bw_return;
      }
      //    std::cout << "  Outer: " << outer_left << ", " << outer_top << " " <<std::endl;

      return true;
    }
  } else {
    //std::cout << expected_parent << " != " << xlib_parent <<std::endl;
    if (xlib_parent) {
      // Return offset of current query_drawable drawable from its parent,
      // PLUS the offset of the parent, and set outer left and top during
      // recurson.
      int x_return, y_return;
      unsigned int w_return, h_return, bw_return, d_return;
      XGetGeometry(screen->display, query_drawable, &root_return, &x_return,
                   &y_return, &w_return, &h_return, &bw_return, &d_return);
      lb += x_return;
      tb += y_return;
      //     std::cout << "add_wm_borders: lb == " << lb << ", tb == " << tb
      //	   << ", bw == " << bw_return << ", query drawable == "
      //           << query_drawable <<std::endl;
      rb = lb;
      bb = lb;
      // At this point, expected parent must be the root, because there
      // is never decoration on subwindows.
      return (add_wm_border_offset(xlib_parent, expected_parent, lb, tb, rb, bb,
                                   outer_left, outer_top));
    } else {
      // nullptr xlib_parent means query_window has no parent now, which
      // is probably due to some race condition.  Can't return valid
      // data, so return false.
      //std::cout << "   nullptr parent, returning false" <<std::endl;
      return false;
    }
  }
}